

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# savefile.c
# Opt level: O0

int pcap_offline_read(pcap_t *p,int cnt,pcap_handler callback,u_char *user)

{
  bpf_insn *pc;
  int iVar1;
  u_int uVar2;
  undefined1 local_60 [8];
  pcap_pkthdr h;
  u_char *data;
  int n;
  int status;
  bpf_insn *fcode;
  u_char *user_local;
  pcap_handler callback_local;
  int cnt_local;
  pcap_t *p_local;
  
  data._0_4_ = 0;
  while( true ) {
    if (p->break_loop != 0) {
      if ((int)data == 0) {
        p->break_loop = 0;
        return -2;
      }
      return (int)data;
    }
    iVar1 = (*p->next_packet_op)(p,(pcap_pkthdr *)local_60,(u_char **)&h.caplen);
    if (iVar1 != 0) break;
    pc = (p->fcode).bf_insns;
    if ((pc == (bpf_insn *)0x0) ||
       (uVar2 = bpf_filter(pc,(u_char *)h._16_8_,h.ts.tv_usec._4_4_,(u_int)h.ts.tv_usec), uVar2 != 0
       )) {
      (*callback)(user,(pcap_pkthdr *)local_60,(u_char *)h._16_8_);
      data._0_4_ = (int)data + 1;
      if ((cnt <= (int)data) && (0 < cnt)) {
        return (int)data;
      }
    }
  }
  if (iVar1 != 1) {
    return iVar1;
  }
  return 0;
}

Assistant:

int
pcap_offline_read(pcap_t *p, int cnt, pcap_handler callback, u_char *user)
{
	struct bpf_insn *fcode;
	int status = 0;
	int n = 0;
	u_char *data;

	while (status == 0) {
		struct pcap_pkthdr h;

		/*
		 * Has "pcap_breakloop()" been called?
		 * If so, return immediately - if we haven't read any
		 * packets, clear the flag and return -2 to indicate
		 * that we were told to break out of the loop, otherwise
		 * leave the flag set, so that the *next* call will break
		 * out of the loop without having read any packets, and
		 * return the number of packets we've processed so far.
		 */
		if (p->break_loop) {
			if (n == 0) {
				p->break_loop = 0;
				return (-2);
			} else
				return (n);
		}

		status = p->next_packet_op(p, &h, &data);
		if (status) {
			if (status == 1)
				return (0);
			return (status);
		}

		if ((fcode = p->fcode.bf_insns) == NULL ||
		    bpf_filter(fcode, data, h.len, h.caplen)) {
			(*callback)(user, &h, data);
			if (++n >= cnt && cnt > 0)
				break;
		}
	}
	/*XXX this breaks semantics tcpslice expects */
	return (n);
}